

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

pool_ptr<soul::AST::Namespace> __thiscall
soul::StructuralParser::parseNamespaceDecl
          (StructuralParser *this,CodeLocation *keywordLocation,ModuleBase *ns)

{
  RefCountedPtr<soul::SourceCodeText> local_18;
  undefined8 local_10;
  
  local_18.object = (SourceCodeText *)(ns->super_ASTObject)._vptr_ASTObject;
  if (local_18.object != (SourceCodeText *)0x0) {
    ((local_18.object)->super_RefCountedObject).refCount =
         ((local_18.object)->super_RefCountedObject).refCount + 1;
  }
  local_10._0_4_ = (ns->super_ASTObject).objectType;
  local_10._4_4_ = *(undefined4 *)&(ns->super_ASTObject).field_0xc;
  parseTopLevelItem<soul::AST::Namespace>
            (this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffe8);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&stack0xffffffffffffffe8);
  return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
}

Assistant:

pool_ptr<AST::Namespace> parseNamespaceDecl (CodeLocation keywordLocation, AST::ModuleBase& ns)   { return parseTopLevelItem<AST::Namespace> (keywordLocation, ns); }